

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageReserve(HelicsMessage message,int reservedSize,HelicsError *err)

{
  Message *pMVar1;
  
  pMVar1 = getMessageObj(message,err);
  if (pMVar1 != (Message *)0x0) {
    helics::SmallBuffer::reserve(&pMVar1->data,(long)reservedSize);
  }
  return;
}

Assistant:

void helicsMessageReserve(HelicsMessage message, int reservedSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.reserve(reservedSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}